

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O1

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitBinaryMultiType
          (AsmJSByteCodeGenerator *this,ParseNode *pnode,EBinaryMathOpCodes op)

{
  AsmJsType *pAVar1;
  AsmJsByteCodeWriter *this_00;
  AsmJsType *this_01;
  ParseNode *pnode_00;
  ParseNode *pnode_01;
  AsmJsFunc *pAVar2;
  bool bVar3;
  Types TVar4;
  RegSlot R0;
  ParseNodeBin *pPVar5;
  RegisterSpace *pRVar6;
  AsmJsCompilationException *this_02;
  char16 *pcVar7;
  char16 *pcVar8;
  ulong uVar9;
  EmitExpressionInfo local_40;
  EmitExpressionInfo lhsEmit;
  EmitExpressionInfo rhsEmit;
  
  pPVar5 = ParseNode::AsParseNodeBin(pnode);
  pnode_00 = pPVar5->pnode1;
  pPVar5 = ParseNode::AsParseNodeBin(pnode);
  pnode_01 = pPVar5->pnode2;
  local_40 = Emit(this,pnode_00);
  lhsEmit = Emit(this,pnode_01);
  if (op < BMO_MUL) {
    if ((local_40.type.which_ == Intish) && ((pnode_00->nop & ~knopName) == knopAdd)) {
      local_40 = (EmitExpressionInfo)((ulong)local_40 & 0xffffffff);
    }
    if ((lhsEmit.type.which_ == Intish) && ((pnode_01->nop & ~knopName) == knopAdd)) {
      lhsEmit = (EmitExpressionInfo)((ulong)lhsEmit & 0xffffffff);
    }
  }
  pAVar1 = &lhsEmit.type;
  this_00 = &this->mWriter;
  ByteCodeWriter::StartStatement(&this_00->super_ByteCodeWriter,pnode,0);
  this_01 = &local_40.type;
  bVar3 = AsmJsType::isInt(this_01);
  if (bVar3) {
    bVar3 = AsmJsType::isInt(pAVar1);
    if (bVar3) {
      pAVar2 = this->mFunction;
      TVar4 = WAsmJs::FromPrimitiveType<int>();
      pRVar6 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                         (&pAVar2->mTypedRegisterAllocator,TVar4);
      if ((local_40.super_EmitInfoBase.location == 0xffffffff) ||
         (pRVar6->mRegisterCount <= local_40.super_EmitInfoBase.location)) {
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,L"Invalid Node location[%d] ",(ulong)local_40 & 0xffffffff);
        goto LAB_00948e31;
      }
      pAVar2 = this->mFunction;
      TVar4 = WAsmJs::FromPrimitiveType<int>();
      pRVar6 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                         (&pAVar2->mTypedRegisterAllocator,TVar4);
      if ((lhsEmit.super_EmitInfoBase.location == 0xffffffff) ||
         (pRVar6->mRegisterCount <= lhsEmit.super_EmitInfoBase.location)) {
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,L"Invalid Node location[%d] ",(ulong)lhsEmit & 0xffffffff);
        goto LAB_00948e31;
      }
      bVar3 = AsmJsType::isSigned(this_01);
      uVar9 = 1;
      pAVar1 = &lhsEmit.type;
      if (bVar3) {
        bVar3 = AsmJsType::isSigned(pAVar1);
        uVar9 = (ulong)!bVar3;
      }
      if (op - BMO_DIV < 2) {
        bVar3 = AsmJsType::isSigned(this_01);
        if (bVar3) {
          bVar3 = AsmJsType::isSigned(pAVar1);
          if (bVar3) goto LAB_00948af8;
        }
        bVar3 = AsmJsType::isUnsigned(this_01);
        if (bVar3) {
          bVar3 = AsmJsType::isUnsigned(pAVar1);
          if (bVar3) goto LAB_00948af8;
        }
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        pcVar7 = AsmJsType::toChars(this_01);
        pcVar8 = AsmJsType::toChars(&lhsEmit.type);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,
                   L"arguments to / or %% must both be double?, float?, signed, or unsigned; %s and %s given"
                   ,pcVar7,pcVar8);
        goto LAB_00948e31;
      }
LAB_00948af8:
      R0 = GetAndReleaseBinaryLocations<int>(this,&local_40,&lhsEmit);
      AsmJsByteCodeWriter::AsmReg3
                (this_00,*(OpCodeAsmJs *)(BinaryMathOpCodes + uVar9 * 2 + (long)(int)op * 8),R0,
                 local_40.super_EmitInfoBase.location,lhsEmit.super_EmitInfoBase.location);
      uVar9 = 0xc00000000;
      goto LAB_00948cf5;
    }
  }
  bVar3 = AsmJsType::isMaybeDouble(this_01);
  if (bVar3) {
    bVar3 = AsmJsType::isMaybeDouble(pAVar1);
    if (bVar3) {
      pAVar2 = this->mFunction;
      TVar4 = WAsmJs::FromPrimitiveType<double>();
      pRVar6 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                         (&pAVar2->mTypedRegisterAllocator,TVar4);
      if ((local_40.super_EmitInfoBase.location == 0xffffffff) ||
         (pRVar6->mRegisterCount <= local_40.super_EmitInfoBase.location)) {
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,L"Invalid Node location[%d] ",(ulong)local_40 & 0xffffffff);
        goto LAB_00948e31;
      }
      pAVar2 = this->mFunction;
      TVar4 = WAsmJs::FromPrimitiveType<double>();
      pRVar6 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                         (&pAVar2->mTypedRegisterAllocator,TVar4);
      if ((lhsEmit.super_EmitInfoBase.location == 0xffffffff) ||
         (pRVar6->mRegisterCount <= lhsEmit.super_EmitInfoBase.location)) {
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,L"Invalid Node location[%d] ",(ulong)lhsEmit & 0xffffffff);
        goto LAB_00948e31;
      }
      R0 = GetAndReleaseBinaryLocations<double>(this,&local_40,&lhsEmit);
      AsmJsByteCodeWriter::AsmReg3
                (this_00,*(OpCodeAsmJs *)(BinaryMathOpCodes + (long)(int)op * 8 + 6),R0,
                 local_40.super_EmitInfoBase.location,lhsEmit.super_EmitInfoBase.location);
      uVar9 = 0x200000000;
      goto LAB_00948cf5;
    }
  }
  bVar3 = AsmJsType::isMaybeFloat(this_01);
  if (bVar3) {
    bVar3 = AsmJsType::isMaybeFloat(pAVar1);
    if (bVar3) {
      if (((long)(int)op & 0x1fffffffffffffffU) == 4) {
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,L"invalid Binary float operation");
      }
      else {
        pAVar2 = this->mFunction;
        TVar4 = WAsmJs::FromPrimitiveType<float>();
        pRVar6 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                           (&pAVar2->mTypedRegisterAllocator,TVar4);
        if ((local_40.super_EmitInfoBase.location == 0xffffffff) ||
           (pRVar6->mRegisterCount <= local_40.super_EmitInfoBase.location)) {
          this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
          AsmJsCompilationException::AsmJsCompilationException
                    (this_02,L"Invalid Node location[%d] ",(ulong)local_40 & 0xffffffff);
        }
        else {
          pAVar2 = this->mFunction;
          TVar4 = WAsmJs::FromPrimitiveType<float>();
          pRVar6 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                             (&pAVar2->mTypedRegisterAllocator,TVar4);
          if ((lhsEmit.super_EmitInfoBase.location != 0xffffffff) &&
             (lhsEmit.super_EmitInfoBase.location < pRVar6->mRegisterCount)) {
            R0 = GetAndReleaseBinaryLocations<float>(this,&local_40,&lhsEmit);
            AsmJsByteCodeWriter::AsmReg3
                      (this_00,*(OpCodeAsmJs *)(BinaryMathOpCodes + (long)(int)op * 8 + 4),R0,
                       local_40.super_EmitInfoBase.location,lhsEmit.super_EmitInfoBase.location);
            uVar9 = 0x700000000;
LAB_00948cf5:
            ByteCodeWriter::EndStatement(&this_00->super_ByteCodeWriter,pnode);
            return (EmitExpressionInfo)(R0 | uVar9);
          }
          this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
          AsmJsCompilationException::AsmJsCompilationException
                    (this_02,L"Invalid Node location[%d] ",(ulong)lhsEmit & 0xffffffff);
        }
      }
      goto LAB_00948e31;
    }
  }
  this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
  AsmJsCompilationException::AsmJsCompilationException(this_02,L"Unsupported math operation");
LAB_00948e31:
  __cxa_throw(this_02,&AsmJsCompilationException::typeinfo,0);
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitBinaryMultiType( ParseNode * pnode, EBinaryMathOpCodes op )
    {
        ParseNode* lhs = ParserWrapper::GetBinaryLeft(pnode);
        ParseNode* rhs = ParserWrapper::GetBinaryRight(pnode);

        EmitExpressionInfo lhsEmit = Emit( lhs );
        EmitExpressionInfo rhsEmit = Emit( rhs );
        AsmJsType& lType = lhsEmit.type;
        AsmJsType& rType = rhsEmit.type;

        // don't need coercion inside an a+b+c type expression
        if (op == BMO_ADD || op == BMO_SUB)
        {
            if (lType.GetWhich() == AsmJsType::Intish && (lhs->nop == knopAdd || lhs->nop == knopSub))
            {
                lType = AsmJsType::Int;
            }
            if (rType.GetWhich() == AsmJsType::Intish && (rhs->nop == knopAdd || rhs->nop == knopSub))
            {
                rType = AsmJsType::Int;
            }
        }

        EmitExpressionInfo emitInfo( AsmJsType::Double );
        StartStatement(pnode);
        if( lType.isInt() && rType.isInt() )
        {
            CheckNodeLocation( lhsEmit, int );
            CheckNodeLocation( rhsEmit, int );
            // because fixnum can be either signed or unsigned, use both lhs and rhs to infer sign
            auto opType = (lType.isSigned() && rType.isSigned()) ? BMOT_Int : BMOT_UInt;
            if (op == BMO_REM || op == BMO_DIV)
            {
                // div and rem must have explicit sign
                if (!(lType.isSigned() && rType.isSigned()) && !(lType.isUnsigned() && rType.isUnsigned()))
                {
                    throw AsmJsCompilationException(_u("arguments to / or %% must both be double?, float?, signed, or unsigned; %s and %s given"), lType.toChars(), rType.toChars());
                }
            }

            // try to reuse tmp register
            RegSlot intReg = GetAndReleaseBinaryLocations<int>( &lhsEmit, &rhsEmit );
            mWriter.AsmReg3(BinaryMathOpCodes[op][opType], intReg, lhsEmit.location, rhsEmit.location );
            emitInfo.location = intReg;
            emitInfo.type = AsmJsType::Intish;
        }
        else if (lType.isMaybeDouble() && rType.isMaybeDouble())
        {
            CheckNodeLocation( lhsEmit, double );
            CheckNodeLocation( rhsEmit, double );

            RegSlot dbReg = GetAndReleaseBinaryLocations<double>( &lhsEmit, &rhsEmit );
            mWriter.AsmReg3( BinaryMathOpCodes[op][BMOT_Double], dbReg, lhsEmit.location, rhsEmit.location );
            emitInfo.location = dbReg;
        }
        else if (lType.isMaybeFloat() && rType.isMaybeFloat())
        {
            if (BinaryMathOpCodes[op][BMOT_Float] == OpCodeAsmJs::Nop)
            {
                throw AsmJsCompilationException(_u("invalid Binary float operation"));
            }

            CheckNodeLocation(lhsEmit, float);
            CheckNodeLocation(rhsEmit, float);

            RegSlot floatReg = GetAndReleaseBinaryLocations<float>(&lhsEmit, &rhsEmit);
            mWriter.AsmReg3(BinaryMathOpCodes[op][BMOT_Float], floatReg, lhsEmit.location, rhsEmit.location);
            emitInfo.location = floatReg;
            emitInfo.type = AsmJsType::Floatish;
        }
        else
        {
            throw AsmJsCompilationException( _u("Unsupported math operation") );
        }
        EndStatement(pnode);
        return emitInfo;
    }